

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmServer.cxx
# Opt level: O3

void __thiscall cmServer::PrintHello(cmServer *this,cmConnection *connection)

{
  pointer ppcVar1;
  int iVar2;
  Value *pVVar3;
  Int value;
  Value *pVVar4;
  cmServer *this_00;
  pointer ppcVar5;
  Value hello;
  Value tmp;
  Value local_148;
  undefined1 local_120 [80];
  Value local_d0;
  Value local_a8;
  Value local_80;
  
  Json::Value::Value(&local_148,objectValue);
  Json::Value::Value((Value *)(local_120 + 0x28),"hello");
  pVVar3 = Json::Value::operator[](&local_148,&kTYPE_KEY_abi_cxx11_);
  Json::Value::operator=(pVVar3,(Value *)(local_120 + 0x28));
  Json::Value::~Value((Value *)(local_120 + 0x28));
  Json::Value::Value((Value *)local_120,arrayValue);
  pVVar3 = Json::Value::operator[](&local_148,&kSUPPORTED_PROTOCOL_VERSIONS_abi_cxx11_);
  pVVar3 = Json::Value::operator=(pVVar3,(Value *)local_120);
  this_00 = (cmServer *)local_120;
  Json::Value::~Value((Value *)this_00);
  ppcVar5 = (this->SupportedProtocols).
            super__Vector_base<cmServerProtocol_*,_std::allocator<cmServerProtocol_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppcVar1 = (this->SupportedProtocols).
            super__Vector_base<cmServerProtocol_*,_std::allocator<cmServerProtocol_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppcVar5 != ppcVar1) {
    do {
      iVar2 = (*(*ppcVar5)->_vptr_cmServerProtocol[2])();
      Json::Value::Value((Value *)&stack0xffffffffffffffa8,objectValue);
      Json::Value::Value(&local_80,iVar2);
      pVVar4 = Json::Value::operator[]((Value *)&stack0xffffffffffffffa8,&kMAJOR_KEY_abi_cxx11_);
      Json::Value::operator=(pVVar4,&local_80);
      Json::Value::~Value(&local_80);
      Json::Value::Value(&local_a8,value);
      pVVar4 = Json::Value::operator[]((Value *)&stack0xffffffffffffffa8,&kMINOR_KEY_abi_cxx11_);
      Json::Value::operator=(pVVar4,&local_a8);
      Json::Value::~Value(&local_a8);
      iVar2 = (*(*ppcVar5)->_vptr_cmServerProtocol[3])();
      if ((char)iVar2 != '\0') {
        Json::Value::Value(&local_d0,true);
        pVVar4 = Json::Value::operator[]
                           ((Value *)&stack0xffffffffffffffa8,&kIS_EXPERIMENTAL_KEY_abi_cxx11_);
        Json::Value::operator=(pVVar4,&local_d0);
        Json::Value::~Value(&local_d0);
      }
      Json::Value::append(pVVar3,(Value *)&stack0xffffffffffffffa8);
      this_00 = (cmServer *)&stack0xffffffffffffffa8;
      Json::Value::~Value((Value *)&stack0xffffffffffffffa8);
      ppcVar5 = ppcVar5 + 1;
    } while (ppcVar5 != ppcVar1);
  }
  WriteJsonObject(this_00,connection,&local_148,(DebugInfo *)0x0);
  Json::Value::~Value(&local_148);
  return;
}

Assistant:

void cmServer::PrintHello(cmConnection* connection) const
{
  Json::Value hello = Json::objectValue;
  hello[kTYPE_KEY] = "hello";

  Json::Value& protocolVersions = hello[kSUPPORTED_PROTOCOL_VERSIONS] =
    Json::arrayValue;

  for (auto const& proto : this->SupportedProtocols) {
    auto version = proto->ProtocolVersion();
    Json::Value tmp = Json::objectValue;
    tmp[kMAJOR_KEY] = version.first;
    tmp[kMINOR_KEY] = version.second;
    if (proto->IsExperimental()) {
      tmp[kIS_EXPERIMENTAL_KEY] = true;
    }
    protocolVersions.append(tmp);
  }

  this->WriteJsonObject(connection, hello, nullptr);
}